

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type,bool can_override)

{
  char *__s;
  allocator<char> local_35 [19];
  allocator<char> local_22;
  undefined1 local_21;
  Type *pTStack_20;
  bool can_override_local;
  Type *type_local;
  SwiftGenerator *this_local;
  
  local_21 = can_override;
  pTStack_20 = type;
  type_local = (Type *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  if (can_override) {
    if (type->enum_def != (EnumDef *)0x0) {
      IdlNamer::NamespacedType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&type->enum_def->super_Definition);
      return __return_storage_ptr__;
    }
    if (type->base_type == BASE_TYPE_BOOL) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Bool",&local_22);
      std::allocator<char>::~allocator(&local_22);
      return __return_storage_ptr__;
    }
  }
  __s = GenTypeBasic::swift_type[(int)type->base_type];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool can_override) const {
    // clang-format off
    static const char * const swift_type[] = {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, \
              CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, RTYPE, KTYPE, STYPE, ...) \
        #STYPE,
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    };
    // clang-format on
    if (can_override) {
      if (type.enum_def) return namer_.NamespacedType(*type.enum_def);
      if (type.base_type == BASE_TYPE_BOOL) return "Bool";
    }
    return swift_type[static_cast<int>(type.base_type)];
  }